

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

bool lest::is_number(text *arg)

{
  long lVar1;
  bool bVar2;
  text digits;
  allocator local_59;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  undefined8 uStack_20;
  
  std::__cxx11::string::string((string *)&local_38,"0123456789",&local_59);
  local_58 = local_48;
  if (local_38 == local_28) {
    uStack_40 = uStack_20;
  }
  else {
    local_58 = local_38;
  }
  local_50 = local_30;
  local_30 = 0;
  local_28[0] = 0;
  local_38 = local_28;
  std::__cxx11::string::~string((string *)&local_38);
  bVar2 = false;
  lVar1 = std::__cxx11::string::find_first_of((string *)arg,(ulong)&local_58);
  if (lVar1 != -1) {
    lVar1 = std::__cxx11::string::find_first_not_of((string *)arg,(ulong)&local_58);
    bVar2 = lVar1 == -1;
  }
  std::__cxx11::string::~string((string *)&local_58);
  return bVar2;
}

Assistant:

inline bool is_number( text arg )
{
    const text digits = "0123456789";
    return text::npos != arg.find_first_of    ( digits )
        && text::npos == arg.find_first_not_of( digits );
}